

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

Bac_Man_t * Bac_ManInsertGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  Bac_Man_t *pNew_00;
  Bac_Man_t *pNew;
  Gia_Man_t *pGia_local;
  Bac_Man_t *p_local;
  
  pNew_00 = Bac_ManDupUserBoxes(p);
  Bac_ManMarkNodesGia(p,pGia);
  Bac_ManRemapBarbufs(pNew_00,p);
  Bac_NtkInsertGia(pNew_00,pGia);
  Bac_ManMoveNames(pNew_00,p);
  return pNew_00;
}

Assistant:

Bac_Man_t * Bac_ManInsertGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Bac_Man_t * pNew = Bac_ManDupUserBoxes( p );
    Bac_ManMarkNodesGia( p, pGia );
    Bac_ManRemapBarbufs( pNew, p );
    Bac_NtkInsertGia( pNew, pGia );
    Bac_ManMoveNames( pNew, p );
    return pNew;
}